

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

base_learner * lda_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  uint32_t uVar3;
  parser *ppVar4;
  option_group_definition *ring_size;
  pointer plVar5;
  ostream *this;
  float *pfVar6;
  size_t sVar7;
  parser *ppVar8;
  learner<lda,_example> *this_00;
  vw *in_RSI;
  long *in_RDI;
  float fVar9;
  float fVar10;
  learner<lda,_example> *l;
  size_t minibatch2;
  float temp;
  int math_mode;
  option_group_definition new_options;
  free_ptr<lda> ld;
  undefined4 in_stack_fffffffffffff098;
  uint32_t in_stack_fffffffffffff09c;
  typed_option<float> *in_stack_fffffffffffff0a0;
  prediction_type_t pred_type;
  string *in_stack_fffffffffffff0a8;
  code *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0bc;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffff0c0;
  typed_option<float> *in_stack_fffffffffffff0e8;
  option_group_definition *in_stack_fffffffffffff0f0;
  size_t in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff294;
  float local_d60;
  float local_d5c;
  undefined1 local_d58 [24];
  undefined4 local_d40;
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [359];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [359];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [359];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [359];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [359];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<float> local_4f8 [2];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [32];
  typed_option<float> local_368 [2];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_long> local_1d8 [2];
  lda_math_mode local_98;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [72];
  vw *local_18;
  long *local_10;
  typed_option<float> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<lda>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Latent Dirichlet Allocation",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"lda",&local_1f9);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25d7d8);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0a8,(unsigned_long *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<unsigned_long>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Run lda with <int> topics",&local_221);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff0f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"lda_alpha",&local_389);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25d8d6);
  VW::config::make_option<float>(in_stack_fffffffffffff0a8,(float *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<float>::keep(local_368,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff0b0,
             (float)((ulong)in_stack_fffffffffffff0a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b0,"Prior on sparsity of per-document topic weights",&local_3b1);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff0a0,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"lda_rho",&local_519);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25d9f7);
  VW::config::make_option<float>(in_stack_fffffffffffff0a8,(float *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<float>::keep(local_4f8,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff0b0,
             (float)((ulong)in_stack_fffffffffffff0a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"Prior on sparsity of topic distributions",&local_541);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff0a0,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"lda_D",&local_6a9);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25db18);
  VW::config::make_option<float>(in_stack_fffffffffffff0a8,(float *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff0b0,
             (float)((ulong)in_stack_fffffffffffff0a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"Number of documents",&local_6d1);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff0a0,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"lda_epsilon",&local_839);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25dc1d);
  VW::config::make_option<float>(in_stack_fffffffffffff0a8,(float *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff0b0,
             (float)((ulong)in_stack_fffffffffffff0a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"Loop convergence threshold",&local_861);
  ppVar4 = (parser *)
           VW::config::typed_option<float>::help
                     (in_stack_fffffffffffff0a0,
                      (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<float>::typed_option
            (in_stack_fffffffffffff0a0,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  ring_size = VW::config::option_group_definition::add<float>
                        (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"minibatch",&local_9c9);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25dd22);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0a8,(unsigned_long *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0b0,
             (unsigned_long)in_stack_fffffffffffff0a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"Minibatch size, for LDA",&local_9f1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff0f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b58,"math-mode",&local_b59);
  VW::config::make_option<int>(in_stack_fffffffffffff0a8,(int *)in_stack_fffffffffffff0a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff0b0,
             (int)((ulong)in_stack_fffffffffffff0a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b80,"Math mode: simd, accuracy, fast-approx",&local_b81);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_fffffffffffff0a0,
             (typed_option<int> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<int>
            (in_stack_fffffffffffff0f0,(typed_option<int> *)in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"metrics",&local_ce9);
  std::unique_ptr<lda,_void_(*)(void_*)>::operator->((unique_ptr<lda,_void_(*)(void_*)> *)0x25df17);
  VW::config::make_option<bool>(in_stack_fffffffffffff0a8,(bool *)in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d10,"Compute metrics",&local_d11);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff0a0,
             (string *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff0a0,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff0f0,(typed_option<bool> *)in_stack_fffffffffffff0e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0a0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                     ((unique_ptr<lda,_void_(*)(void_*)> *)0x25e25d);
  plVar5->mmode = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"lda",&local_d39);
  bVar2 = (**(code **)(*local_10 + 8))();
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ead8);
    local_18->lda = (uint32_t)plVar5->topics;
    local_18->delete_prediction = delete_scalars;
    memset(local_d58,0,0x18);
    std::vector<index_feature,_std::allocator<index_feature>_>::vector
              ((vector<index_feature,_std::allocator<index_feature>_> *)0x25eb22);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x25eb2f);
    std::vector<index_feature,_std::allocator<index_feature>_>::operator=
              ((vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff0b0,
               (vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff0a8);
    std::vector<index_feature,_std::allocator<index_feature>_>::~vector
              ((vector<index_feature,_std::allocator<index_feature>_> *)in_stack_fffffffffffff0b0);
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25eb60);
    pvVar1 = local_18;
    plVar5->total_lambda_init = false;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25eb84);
    plVar5->all = pvVar1;
    fVar9 = local_18->initial_t;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ebbd);
    plVar5->example_t = (double)fVar9;
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ebdb);
    if ((plVar5->compute_coherence_metrics & 1U) != 0) {
      std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ebf1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff0c0,
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
      std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ec26);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(in_stack_fffffffffffff0c0,
               CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    }
    fVar9 = logf((float)(local_18->lda * 2 + 1));
    fVar10 = logf(2.0);
    local_d5c = ceilf(fVar9 / fVar10);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c);
    local_18->random_weights = true;
    local_18->add_constant = false;
    if (1.0 < local_18->eta) {
      this = std::operator<<((ostream *)&std::cerr,"your learning rate is too high, setting it to 1"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_d60 = 1.0;
      pfVar6 = std::min<float>(&local_18->eta,&local_d60);
      local_18->eta = *pfVar6;
    }
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25eda2);
    sVar7 = next_pow2(plVar5->minibatch);
    if (local_18->p->ring_size < sVar7) {
      ppVar8 = local_18->p;
      if (ppVar8 != (parser *)0x0) {
        parser::~parser((parser *)in_stack_fffffffffffff0b0);
        operator_delete(ppVar8);
      }
      ppVar8 = (parser *)operator_new(0x390);
      parser::parser(ppVar4,(size_t)ring_size);
      local_18->p = ppVar8;
    }
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ee6c);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ee94);
    v_array<float>::resize
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
               in_stack_fffffffffffff288);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x25eeba);
    v_array<float>::push_back
              ((v_array<float> *)in_stack_fffffffffffff0a0,
               (float *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
    pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff0a0 >> 0x20);
    memcpy(&local_18->p->lp,no_label::no_label_parser,0x48);
    std::unique_ptr<lda,_void_(*)(void_*)>::operator->
              ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ef0c);
    plVar5 = std::unique_ptr<lda,_void_(*)(void_*)>::operator->
                       ((unique_ptr<lda,_void_(*)(void_*)> *)0x25ef48);
    if ((plVar5->compute_coherence_metrics & 1U) == 0) {
      in_stack_fffffffffffff0b0 = predict;
    }
    else {
      in_stack_fffffffffffff0b0 = predict_with_metrics;
    }
    ppVar4 = (parser *)in_stack_fffffffffffff0b0;
    uVar3 = parameters::stride_shift
                      ((parameters *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
    this_00 = LEARNER::init_learner<lda,example,LEARNER::learner<char,example>>
                        ((free_ptr<lda> *)ppVar4,
                         (_func_void_lda_ptr_learner<char,_example>_ptr_example_ptr *)
                         CONCAT44(uVar3,in_stack_fffffffffffff0b8),in_stack_fffffffffffff0b0,
                         (size_t)in_stack_fffffffffffff0a8,pred_type);
    LEARNER::learner<lda,_example>::set_save_load(this_00,save_load);
    LEARNER::learner<lda,_example>::set_finish_example(this_00,finish_example);
    LEARNER::learner<lda,_example>::set_end_examples
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff0b8));
    LEARNER::learner<lda,_example>::set_end_pass
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff0b8));
    LEARNER::learner<lda,_example>::set_finish
              ((learner<lda,_example> *)ppVar4,
               (_func_void_lda_ptr *)CONCAT44(uVar3,in_stack_fffffffffffff0b8));
    in_stack_fffffffffffff0a0 = (typed_option<float> *)LEARNER::make_base<lda,example>(this_00);
    local_8 = in_stack_fffffffffffff0a0;
  }
  else {
    local_8 = (typed_option<float> *)0x0;
  }
  local_d40 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0a0);
  std::unique_ptr<lda,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<lda,_void_(*)(void_*)> *)in_stack_fffffffffffff0b0);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}